

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void AddVisibilityCompileOption
               (string *flags,cmTarget *target,cmLocalGenerator *lg,string *lang,string *warnCMP0063
               )

{
  int iVar1;
  cmMakefile *this;
  char *pcVar2;
  ostream *poVar3;
  string *psVar4;
  allocator local_2f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  undefined1 local_2d0 [8];
  string option;
  undefined1 local_290 [8];
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  char *local_d8;
  char *prop;
  string flagDefine;
  char *opt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string compileOption;
  string l;
  string *warnCMP0063_local;
  string *lang_local;
  cmLocalGenerator *lg_local;
  cmTarget *target_local;
  string *flags_local;
  
  std::__cxx11::string::string((string *)(compileOption.field_2._M_local_buf + 8),(string *)lang);
  std::operator+(&local_90,"CMAKE_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (compileOption.field_2._M_local_buf + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 &local_90,"_COMPILE_OPTIONS_VISIBILITY");
  std::__cxx11::string::~string((string *)&local_90);
  this = cmLocalGenerator::GetMakefile(lg);
  pcVar2 = cmMakefile::GetDefinition(this,(string *)local_70);
  if (pcVar2 == (char *)0x0) {
    flagDefine.field_2._12_4_ = 1;
    goto LAB_0049e215;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&compileOption.field_2 + 8),"_VISIBILITY_PRESET");
  local_d8 = cmTarget::GetProperty(target,(string *)&prop);
  if (local_d8 == (char *)0x0) {
    flagDefine.field_2._12_4_ = 1;
  }
  else if (warnCMP0063 == (string *)0x0) {
    iVar1 = strcmp(local_d8,"hidden");
    if (iVar1 != 0) {
      iVar1 = strcmp(local_d8,"default");
      if (iVar1 != 0) {
        iVar1 = strcmp(local_d8,"protected");
        if (iVar1 != 0) {
          iVar1 = strcmp(local_d8,"internal");
          if (iVar1 != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
            poVar3 = std::operator<<((ostream *)local_290,"Target ");
            psVar4 = cmTarget::GetName_abi_cxx11_(target);
            poVar3 = std::operator<<(poVar3,(string *)psVar4);
            poVar3 = std::operator<<(poVar3," uses unsupported value \"");
            poVar3 = std::operator<<(poVar3,local_d8);
            poVar3 = std::operator<<(poVar3,"\" for ");
            poVar3 = std::operator<<(poVar3,(string *)&prop);
            std::operator<<(poVar3,".");
            std::__cxx11::ostringstream::str();
            pcVar2 = (char *)std::__cxx11::string::c_str();
            cmSystemTools::Error(pcVar2,(char *)0x0,(char *)0x0,(char *)0x0);
            std::__cxx11::string::~string((string *)(option.field_2._M_local_buf + 8));
            flagDefine.field_2._12_4_ = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
            goto LAB_0049e209;
          }
        }
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f0,pcVar2,&local_2f1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   &local_2f0,local_d8);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    (*lg->_vptr_cmLocalGenerator[5])(lg,flags,local_2d0);
    std::__cxx11::string::~string((string *)local_2d0);
    flagDefine.field_2._12_4_ = 0;
  }
  else {
    std::operator+(&local_118,"  ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop);
    std::operator+(&local_f8,&local_118,"\n");
    std::__cxx11::string::operator+=((string *)warnCMP0063,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    flagDefine.field_2._12_4_ = 1;
  }
LAB_0049e209:
  std::__cxx11::string::~string((string *)&prop);
LAB_0049e215:
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(compileOption.field_2._M_local_buf + 8));
  return;
}

Assistant:

static void AddVisibilityCompileOption(std::string &flags,
                                       cmTarget const* target,
                                       cmLocalGenerator *lg,
                                       const std::string& lang,
                                       std::string* warnCMP0063)
{
  std::string l(lang);
  std::string compileOption = "CMAKE_" + l + "_COMPILE_OPTIONS_VISIBILITY";
  const char *opt = lg->GetMakefile()->GetDefinition(compileOption);
  if (!opt)
    {
    return;
    }
  std::string flagDefine = l + "_VISIBILITY_PRESET";

  const char *prop = target->GetProperty(flagDefine);
  if (!prop)
    {
    return;
    }
  if (warnCMP0063)
    {
    *warnCMP0063 += "  " + flagDefine + "\n";
    return;
    }
  if (strcmp(prop, "hidden") != 0
      && strcmp(prop, "default") != 0
      && strcmp(prop, "protected") != 0
      && strcmp(prop, "internal") != 0 )
    {
    std::ostringstream e;
    e << "Target " << target->GetName() << " uses unsupported value \""
      << prop << "\" for " << flagDefine << ".";
    cmSystemTools::Error(e.str().c_str());
    return;
    }
  std::string option = std::string(opt) + prop;
  lg->AppendFlags(flags, option);
}